

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpfaketransmitter.cpp
# Opt level: O0

void __thiscall
jrtplib::RTPFakeTransmitter::DeleteTransmissionInfo
          (RTPFakeTransmitter *this,RTPTransmissionInfo *inf)

{
  RTPMemoryManager *mgr;
  RTPTransmissionInfo *inf_local;
  RTPFakeTransmitter *this_local;
  
  if ((this->init & 1U) != 0) {
    mgr = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
    RTPDelete<jrtplib::RTPTransmissionInfo>(inf,mgr);
  }
  return;
}

Assistant:

void RTPFakeTransmitter::DeleteTransmissionInfo(RTPTransmissionInfo *inf)
{
	if (!init)
		return;
	RTPDelete(inf,GetMemoryManager());
}